

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcControl::~IfcControl(IfcControl *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this->super_IfcObject = 0x80e5b8;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x80e630;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x80e5e0;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x80e608;
  puVar1 = *(undefined1 **)
            &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  if (puVar1 != &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
                 .field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this->super_IfcObject = 0x80e6d0;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x80e6f8;
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x60;
  if (puVar1 != &(this->super_IfcObject).field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x38;
  if (puVar1 != &(this->super_IfcObject).field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  if (puVar1 != &(this->super_IfcObject).field_0x20) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcControl() : Object("IfcControl") {}